

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

void Js::DynamicTypeHandler::SetSlotUnchecked(DynamicObject *instance,int index,Var value)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  int iVar7;
  WriteBarrierPtr<void> *pWVar8;
  
  bVar4 = ThreadContext::IsOnStack(instance);
  if (!bVar4) {
    bVar4 = ThreadContext::IsOnStack(value);
    if (bVar4) {
      bVar4 = VarIs<Js::RecyclableObject>(value);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0x87,
                                    "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                    ,
                                    "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                                   );
        if (!bVar4) goto LAB_00e5ff17;
        *puVar5 = 0;
      }
    }
  }
  pDVar6 = DynamicObject::GetTypeHandler(instance);
  uVar1 = pDVar6->inlineSlotCapacity;
  pDVar6 = DynamicObject::GetTypeHandler(instance);
  uVar2 = pDVar6->offsetOfInlineSlots;
  pDVar6 = DynamicObject::GetTypeHandler(instance);
  iVar7 = index - (uint)uVar1;
  if (index < (int)(uint)uVar1) {
    pWVar8 = (WriteBarrierPtr<void> *)
             ((long)&(instance->super_RecyclableObject).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar2);
    iVar7 = index;
  }
  else {
    if ((int)(pDVar6->slotCapacity - (uint)uVar1) <= iVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x93,
                                  "((index - inlineSlotCapacity) < (slotCapacity - inlineSlotCapacity))"
                                  ,
                                  "(index - inlineSlotCapacity) < (slotCapacity - inlineSlotCapacity)"
                                 );
      if (!bVar4) {
LAB_00e5ff17:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pWVar8 = (instance->auxSlots).ptr;
  }
  pWVar8 = pWVar8 + iVar7;
  Memory::Recycler::WBSetBit((char *)pWVar8);
  pWVar8->ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar8);
  return;
}

Assistant:

void DynamicTypeHandler::SetSlotUnchecked(DynamicObject * instance, int index, Var value)
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        uint16 inlineSlotCapacity = instance->GetTypeHandler()->GetInlineSlotCapacity();
        uint16 offsetOfInlineSlots = instance->GetTypeHandler()->GetOffsetOfInlineSlots();
        int slotCapacity = instance->GetTypeHandler()->GetSlotCapacity();

        if (index < inlineSlotCapacity)
        {
            Field(Var) * slots = reinterpret_cast<Field(Var)*>(reinterpret_cast<size_t>(instance) + offsetOfInlineSlots);
            slots[index] = value;
        }
        else
        {
            Assert((index - inlineSlotCapacity) < (slotCapacity - inlineSlotCapacity));
            instance->auxSlots[index - inlineSlotCapacity] = value;
        }
    }